

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmocka.c
# Opt level: O1

int cmocka_run_one_test_or_fixture
              (char *function_name,CMUnitTestFunction test_func,CMFixtureFunction setup_func,
              CMFixtureFunction teardown_func,void **state,void *heap_check_point)

{
  long *plVar1;
  undefined8 *puVar2;
  int iVar3;
  int iVar4;
  __sighandler_t p_Var5;
  long lVar6;
  ListNode *test_name;
  SignalFunction *pp_Var7;
  long *in_FS_OFFSET;
  ListNode *check_point;
  void *current_state;
  void *local_40;
  long local_38;
  
  local_38 = in_FS_OFFSET[5];
  if (heap_check_point == (void *)0x0) {
    lVar6 = *in_FS_OFFSET;
    plVar1 = (long *)(lVar6 + -0x38);
    if (*plVar1 == 0) {
      *(long **)(lVar6 + -0x28) = plVar1;
      *(long **)(lVar6 + -0x20) = plVar1;
      *(undefined4 *)(lVar6 + -0x30) = 1;
      *plVar1 = 1;
    }
    heap_check_point = *(void **)(lVar6 + -0x20);
  }
  local_40 = (void *)0x0;
  pp_Var7 = default_signal_functions;
  lVar6 = 0;
  do {
    p_Var5 = signal(*(int *)((long)exception_signals + lVar6),exception_handler);
    *pp_Var7 = (SignalFunction)p_Var5;
    pp_Var7 = pp_Var7 + 1;
    lVar6 = lVar6 + 4;
  } while (lVar6 != 0x14);
  lVar6 = *in_FS_OFFSET;
  puVar2 = (undefined8 *)(lVar6 + -400);
  *puVar2 = 0;
  *(undefined8 **)(lVar6 + -0x180) = puVar2;
  *(undefined8 **)(lVar6 + -0x178) = puVar2;
  *(undefined4 *)(lVar6 + -0x188) = 1;
  *(undefined8 *)(lVar6 + -0x170) = 0;
  *(undefined4 *)(lVar6 + -0x168) = 0;
  puVar2 = (undefined8 *)(lVar6 + -0x140);
  *puVar2 = 0;
  *(undefined8 **)(lVar6 + -0x130) = puVar2;
  *(undefined8 **)(lVar6 + -0x128) = puVar2;
  *(undefined4 *)(lVar6 + -0x138) = 1;
  *(undefined8 *)(lVar6 + -0x120) = 0;
  *(undefined4 *)(lVar6 + -0x118) = 0;
  puVar2 = (undefined8 *)(lVar6 + -0x160);
  *puVar2 = 0;
  *(undefined8 **)(lVar6 + -0x150) = puVar2;
  *(undefined8 **)(lVar6 + -0x148) = puVar2;
  *(undefined4 *)(lVar6 + -0x158) = 1;
  *(undefined4 *)(lVar6 + -0x108) = 1;
  test_name = (ListNode *)(lVar6 + -0x100);
  iVar3 = __sigsetjmp();
  iVar4 = -1;
  if (iVar3 != 0) goto LAB_00125286;
  if (test_func == (CMUnitTestFunction)0x0) {
    if (setup_func == (CMFixtureFunction)0x0) {
      if (teardown_func == (CMFixtureFunction)0x0) goto LAB_00125240;
      if (state == (void **)0x0) {
        state = &local_40;
      }
      iVar4 = (*teardown_func)(state);
      fail_if_blocks_allocated((ListNode *)heap_check_point,function_name);
    }
    else {
      heap_check_point = state;
      if (state == (void **)0x0) {
        heap_check_point = &local_40;
      }
      iVar4 = (*setup_func)((void **)heap_check_point);
    }
  }
  else {
    if (state == (void **)0x0) {
      state = &local_40;
    }
    (*test_func)(state);
    fail_if_blocks_allocated((ListNode *)heap_check_point,function_name);
    test_name = (ListNode *)heap_check_point;
LAB_00125240:
    heap_check_point = test_name;
    iVar4 = 0;
  }
  fail_if_leftover_values((char *)heap_check_point);
  test_name = (ListNode *)heap_check_point;
LAB_00125286:
  *(undefined4 *)(lVar6 + -0x108) = 0;
  teardown_testing((char *)test_name);
  pp_Var7 = default_signal_functions;
  lVar6 = 0;
  do {
    signal(*(int *)((long)exception_signals + lVar6),(__sighandler_t)*pp_Var7);
    pp_Var7 = pp_Var7 + 1;
    lVar6 = lVar6 + 4;
  } while (lVar6 != 0x14);
  if (in_FS_OFFSET[5] != local_38) {
    __stack_chk_fail();
  }
  return iVar4;
}

Assistant:

static int cmocka_run_one_test_or_fixture(const char *function_name,
                                          CMUnitTestFunction test_func,
                                          CMFixtureFunction setup_func,
                                          CMFixtureFunction teardown_func,
                                          void ** const volatile state,
                                          const void *const heap_check_point)
{
    const ListNode * const volatile check_point = (const ListNode*)
        (heap_check_point != NULL ?
         heap_check_point : check_point_allocated_blocks());
    int handle_exceptions = 1;
    void *current_state = NULL;
    int rc = 0;

    /* FIXME check only one test or fixture is set */

    /* Detect if we should handle exceptions */
#ifdef _WIN32
    handle_exceptions = !IsDebuggerPresent();
#endif /* _WIN32 */
#ifdef UNIT_TESTING_DEBUG
    handle_exceptions = 0;
#endif /* UNIT_TESTING_DEBUG */


    if (handle_exceptions) {
#ifndef _WIN32
        unsigned int i;
        for (i = 0; i < ARRAY_SIZE(exception_signals); i++) {
            default_signal_functions[i] = signal(
                    exception_signals[i], exception_handler);
        }
#else /* _WIN32 */
        previous_exception_filter = SetUnhandledExceptionFilter(
                exception_filter);
#endif /* !_WIN32 */
    }

    /* Init the test structure */
    initialize_testing(function_name);

    global_running_test = 1;

    if (cm_setjmp(global_run_test_env) == 0) {
        if (test_func != NULL) {
            test_func(state != NULL ? state : &current_state);

            fail_if_blocks_allocated(check_point, function_name);
            rc = 0;
        } else if (setup_func != NULL) {
            rc = setup_func(state != NULL ? state : &current_state);

            /*
             * For setup we can ignore any allocated blocks. We just need to
             * ensure they're deallocated on tear down.
             */
        } else if (teardown_func != NULL) {
            rc = teardown_func(state != NULL ? state : &current_state);

            fail_if_blocks_allocated(check_point, function_name);
        } else {
            /* ERROR */
        }
        fail_if_leftover_values(function_name);
        global_running_test = 0;
    } else {
        /* TEST FAILED */
        global_running_test = 0;
        rc = -1;
    }
    teardown_testing(function_name);

    if (handle_exceptions) {
#ifndef _WIN32
        unsigned int i;
        for (i = 0; i < ARRAY_SIZE(exception_signals); i++) {
            signal(exception_signals[i], default_signal_functions[i]);
        }
#else /* _WIN32 */
        if (previous_exception_filter) {
            SetUnhandledExceptionFilter(previous_exception_filter);
            previous_exception_filter = NULL;
        }
#endif /* !_WIN32 */
    }

    return rc;
}